

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PushScope(cmMakefile *this)

{
  Internals::PushDefinitions((this->Internal).x_);
  PushLoopBlockBarrier(this);
  cmFileLockPool::PushFunctionScope(&this->LocalGenerator->GlobalGenerator->FileLockPool);
  return;
}

Assistant:

void cmMakefile::PushScope()
{
  this->Internal->PushDefinitions();

  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif
}